

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5SorterNext(Fts5Cursor *pCsr)

{
  Fts5Sorter *pFVar1;
  sqlite3_stmt *psVar2;
  int iVar3;
  uint uVar4;
  Mem *pMVar5;
  i64 iVar6;
  u8 *puVar7;
  int iVar8;
  long lVar9;
  u8 *puVar10;
  int iVal;
  u32 local_3c;
  Fts5Cursor *local_38;
  
  pFVar1 = pCsr->pSorter;
  iVar3 = sqlite3_step(pFVar1->pStmt);
  if (iVar3 == 0x65) {
    uVar4 = 1;
  }
  else {
    if (iVar3 != 100) {
      return iVar3;
    }
    psVar2 = pFVar1->pStmt;
    pMVar5 = columnMem(psVar2,0);
    iVar6 = sqlite3VdbeIntValue(pMVar5);
    columnMallocFailure(psVar2);
    pFVar1->iRowid = iVar6;
    iVar3 = sqlite3_column_bytes(pFVar1->pStmt,1);
    psVar2 = pFVar1->pStmt;
    pMVar5 = columnMem(psVar2,1);
    puVar7 = (u8 *)sqlite3_value_blob(pMVar5);
    columnMallocFailure(psVar2);
    uVar4 = 0x4e;
    if (0 < iVar3) {
      iVar8 = 0;
      puVar10 = puVar7;
      local_38 = pCsr;
      if (pFVar1->nIdx < 2) {
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        do {
          uVar4 = sqlite3Fts5GetVarint32(puVar10,&local_3c);
          puVar10 = puVar10 + uVar4;
          iVar8 = iVar8 + local_3c;
          pFVar1->aIdx[lVar9] = iVar8;
          lVar9 = lVar9 + 1;
        } while (lVar9 < (long)pFVar1->nIdx + -1);
      }
      pFVar1->aIdx[lVar9] = ((int)puVar7 + iVar3) - (int)puVar10;
      pFVar1->aPoslist = puVar10;
      uVar4 = 0x4e;
      pCsr = local_38;
    }
  }
  pCsr->csrflags = pCsr->csrflags | uVar4;
  return 0;
}

Assistant:

static int fts5SorterNext(Fts5Cursor *pCsr){
  Fts5Sorter *pSorter = pCsr->pSorter;
  int rc;

  rc = sqlite3_step(pSorter->pStmt);
  if( rc==SQLITE_DONE ){
    rc = SQLITE_OK;
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }else if( rc==SQLITE_ROW ){
    const u8 *a;
    const u8 *aBlob;
    int nBlob;
    int i;
    int iOff = 0;
    rc = SQLITE_OK;

    pSorter->iRowid = sqlite3_column_int64(pSorter->pStmt, 0);
    nBlob = sqlite3_column_bytes(pSorter->pStmt, 1);
    aBlob = a = sqlite3_column_blob(pSorter->pStmt, 1);

    /* nBlob==0 in detail=none mode. */
    if( nBlob>0 ){
      for(i=0; i<(pSorter->nIdx-1); i++){
        int iVal;
        a += fts5GetVarint32(a, iVal);
        iOff += iVal;
        pSorter->aIdx[i] = iOff;
      }
      pSorter->aIdx[i] = &aBlob[nBlob] - a;
      pSorter->aPoslist = a;
    }

    fts5CsrNewrow(pCsr);
  }

  return rc;
}